

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_filter.cc
# Opt level: O1

int __thiscall
sptk::reaper::FdFilter::FilterArray
          (FdFilter *this,int16_t *input,int nIn,bool first,bool last,int16_t *output,
          int max_to_output)

{
  int16_t iVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  undefined7 in_register_00000009;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int16_t *piVar10;
  long lVar11;
  int iVar12;
  int available;
  uint local_50;
  uint local_4c;
  int local_48;
  int local_44;
  FdFilter *local_40;
  ulong local_38;
  
  if ((int)CONCAT71(in_register_00000009,first) != 0) {
    this->filter_state_ = 1;
    this->array_leftover_ = 0;
    this->array_index_ = 0;
  }
  iVar7 = this->array_leftover_;
  if (iVar7 == 0) {
    iVar6 = 0;
    local_4c = max_to_output;
  }
  else {
    iVar6 = max_to_output;
    if (iVar7 < max_to_output) {
      iVar6 = iVar7;
    }
    iVar8 = this->array_index_;
    if (0 < iVar6) {
      piVar10 = this->output_buffer_ + iVar8;
      iVar12 = 0;
      do {
        *output = *piVar10;
        output = output + 1;
        piVar10 = piVar10 + 1;
        iVar12 = iVar12 + -1;
      } while (-iVar6 != iVar12);
      iVar8 = iVar8 - iVar12;
    }
    this->array_leftover_ = iVar7 - iVar6;
    this->array_index_ = iVar8;
    local_4c = max_to_output - iVar6;
  }
  local_44 = nIn;
  iVar7 = 0;
  local_40 = this;
  if (0 < (int)local_4c) {
    do {
      max_to_output = iVar6;
      iVar7 = nIn;
      if (local_44 < 1) goto LAB_00112d90;
      iVar7 = this->max_input_;
      iVar6 = iVar7;
      if (local_44 < iVar7) {
        iVar6 = local_44;
      }
      uVar2 = this->insert_;
      local_38 = (ulong)uVar2;
      local_48 = iVar6;
      if ((int)uVar2 < 2) {
        if (0 < iVar7) {
          piVar10 = this->input_buffer_;
          if (local_44 < iVar7) {
            iVar7 = local_44;
          }
          lVar11 = 0;
          lVar9 = 0;
          do {
            piVar10[lVar9] = input[lVar9];
            lVar9 = lVar9 + 1;
            lVar11 = lVar11 + -2;
          } while (iVar7 != (int)lVar9);
          input = (int16_t *)((long)input - lVar11);
        }
      }
      else if (0 < iVar7) {
        piVar10 = this->input_buffer_ + 1;
        do {
          iVar1 = *input;
          input = input + 1;
          piVar10[-1] = iVar1;
          memset(piVar10,0,(ulong)(uVar2 - 1) * 2);
          piVar10 = piVar10 + (ulong)(uVar2 - 2) + 2;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      this = local_40;
      iVar7 = local_44 - local_48;
      if ((iVar7 == 0 || local_44 < local_48) && last) {
        *(byte *)&local_40->filter_state_ = (byte)local_40->filter_state_ | 2;
      }
      FilterBuffer(local_40,local_48 * (int)local_38,(int *)&local_50);
      this->filter_state_ = 0;
      uVar2 = local_4c;
      if ((int)local_50 < (int)local_4c) {
        uVar2 = local_50;
      }
      if ((int)local_50 < 1) {
        uVar5 = 0;
      }
      else {
        piVar10 = this->output_buffer_;
        lVar11 = 0;
        uVar5 = 0;
        do {
          output[uVar5] = piVar10[uVar5];
          uVar5 = uVar5 + 1;
          lVar11 = lVar11 + -2;
        } while (uVar2 != uVar5);
        output = (int16_t *)((long)output - lVar11);
      }
      max_to_output = max_to_output + uVar2;
      uVar4 = local_50 - uVar2;
      bVar3 = (int)local_50 < (int)uVar2;
      local_44 = iVar7;
      local_50 = uVar4;
      iVar6 = max_to_output;
    } while (uVar4 == 0 || bVar3);
    this->array_leftover_ = uVar4;
    this->array_index_ = (int)uVar5;
    iVar7 = nIn - iVar7;
  }
LAB_00112d90:
  this->array_samples_used_ = iVar7;
  return max_to_output;
}

Assistant:

int FdFilter::FilterArray(int16_t *input, int nIn, bool first, bool last,
                          int16_t *output, int max_to_output) {
  int i, j, nLeft = nIn, nOut = 0, nToGo = max_to_output;
  int  toRead, toWrite, available;
  int16_t *p = input, *q, *r = output;

  if (first) {
    filter_state_ = 1;  // indicate start of new signal
    array_leftover_ = 0;
    array_index_ = 0;
  }
  if (array_leftover_) {  // First, move any output remaining from the
                         // previous call.
    int toCopy = array_leftover_;
    if (toCopy > nToGo)
      toCopy = nToGo;
    for (i = array_index_, j = 0; j < toCopy; i++, j++)
      *r++ = output_buffer_[i];
    nToGo -= toCopy;
    nOut += toCopy;
    array_leftover_ -= toCopy;
    array_index_ = i;
  }

  if (nToGo <= 0) {
    array_samples_used_ = 0;  // Can't process any input this time; no
                             // room in output array.
    return max_to_output;
  }

  /* Process data from array to array. */
  while (nLeft > 0) {
    toRead = nLeft;
    if (toRead > max_input_)
      toRead = max_input_;
    if (insert_ > 1) {
      for (q = input_buffer_, i = 0; i < toRead; i++) {
        *q++ = *p++;
        for (j = 1; j < insert_; j++)
          *q++ = 0;
      }
    } else {
      for (q = input_buffer_, i = 0; i < toRead; i++)
        *q++ = *p++;
    }
    nLeft -= toRead;
    if ((nLeft <= 0) && last)
      filter_state_ |= 2;  // Indicate that end of signal is (also) in
                           // this bufferful.
    FilterBuffer(toRead * insert_, &available);
    filter_state_ = 0;  // Clear the initialization bit, if any for the
                       // next iteration.

    toWrite = available;
    if (toWrite > nToGo)
      toWrite = nToGo;

    for (i = 0; i < toWrite; i++)
      *r++ = output_buffer_[i];
    nOut += toWrite;
    available -= toWrite;
    if (available > 0) {  // Ran out of output space; suspend processing
      array_leftover_ = available;  // Save the remaining output
                                    // samples for the next call.
      array_index_ = i;
      array_samples_used_ = nIn - nLeft;  // Record the number of input
                                         // samples actually used.
      return(nOut);
    }
  }
  array_samples_used_ = nIn;
  return(nOut);
}